

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O1

uint32_t __thiscall
ddd::DaTrie<true,_false,_false>::xcheck_
          (DaTrie<true,_false,_false> *this,Edge *edge,
          vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *blocks)

{
  uint uVar1;
  uint32_t uVar2;
  
  if (edge->size_ == 1) {
    if ((ulong)this->head_pos_ == 0xffffffff) {
      uVar1 = (uint)((ulong)((long)(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 3) ^
              (uint)edge->labels_[0];
    }
    else {
      uVar1 = (uint)edge->labels_[0] ^
              (blocks->super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>)._M_impl.
              super__Vector_impl_data._M_start[this->head_pos_].head;
    }
  }
  else {
    uVar1 = this->head_pos_;
    if (uVar1 != 0xffffffff) {
      do {
        uVar2 = xcheck_in_block_(this,edge,uVar1,blocks);
        if (uVar2 != 0xffffffff) {
          return uVar2;
        }
        uVar1 = (blocks->super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>).
                _M_impl.super__Vector_impl_data._M_start[uVar1].next;
      } while (uVar1 != this->head_pos_);
    }
    uVar1 = (uint)edge->labels_[0] ^
            (uint)((ulong)((long)(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 3);
  }
  return uVar1;
}

Assistant:

uint32_t xcheck_(const Edge& edge, const std::vector<BlockLink>& blocks) const {
    assert(0 < edge.size());

    if (edge.size() == 1) {
      return xcheck_(*edge.begin(), blocks);
    }

    if (head_pos_ == NOT_FOUND) {
      return bc_size() ^ *edge.begin();
    }

    auto block_pos = head_pos_;
    do {
      auto base = xcheck_in_block_(edge, block_pos, blocks);
      if (base != NOT_FOUND) {
        return base;
      }
    } while ((block_pos = blocks[block_pos].next) != head_pos_);

    return bc_size() ^ *edge.begin();
  }